

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::remaxCol(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int p_col,int len)

{
  int *piVar1;
  Dring *pDVar2;
  Dring *pDVar3;
  Dring *pDVar4;
  type_conflict5 tVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  long local_b0;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  if ((Col *)(this->u).col.elem[p_col].next == &(this->u).col) {
    iVar10 = len - (this->u).col.max[p_col];
    iVar7 = (this->u).col.used;
    if ((this->u).col.size - iVar7 < iVar10) {
      packColumns(this);
      iVar10 = len - (this->u).col.max[p_col];
      local_68.fpclass = cpp_dec_float_finite;
      local_68.prec_elem = 10;
      local_68.data._M_elems[0] = 0;
      local_68.data._M_elems[1] = 0;
      local_68.data._M_elems[2] = 0;
      local_68.data._M_elems[3] = 0;
      local_68.data._M_elems[4] = 0;
      local_68.data._M_elems[5] = 0;
      local_68.data._M_elems._24_5_ = 0;
      local_68.data._M_elems[7]._1_3_ = 0;
      local_68.data._M_elems._32_5_ = 0;
      local_68._37_8_ = 0;
      local_a8.data._M_elems._0_8_ = SEXT48((this->u).col.used);
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                (&local_68,&(this->colMemMult).m_backend,(longlong *)&local_a8);
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 10;
      local_a8.data._M_elems[0] = 0;
      local_a8.data._M_elems[1] = 0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems._24_5_ = 0;
      local_a8.data._M_elems[7]._1_3_ = 0;
      local_a8.data._M_elems._32_5_ = 0;
      local_a8._37_8_ = 0;
      local_b0 = (long)len;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                (&local_a8,&local_68,&local_b0);
      tVar5 = boost::multiprecision::operator<
                        (&(this->u).col.size,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_a8);
      iVar7 = (this->u).col.used;
      if (tVar5) {
        minColMem(this,len + iVar7 * 2);
        iVar7 = (this->u).col.used;
      }
    }
    (this->u).col.used = iVar7 + iVar10;
    (this->u).col.max[p_col] = len;
  }
  else {
    iVar7 = (this->u).col.used;
    if ((this->u).col.size - iVar7 < len) {
      packColumns(this);
      local_68.fpclass = cpp_dec_float_finite;
      local_68.prec_elem = 10;
      local_68.data._M_elems[0] = 0;
      local_68.data._M_elems[1] = 0;
      local_68.data._M_elems[2] = 0;
      local_68.data._M_elems[3] = 0;
      local_68.data._M_elems[4] = 0;
      local_68.data._M_elems[5] = 0;
      local_68.data._M_elems._24_5_ = 0;
      local_68.data._M_elems[7]._1_3_ = 0;
      local_68.data._M_elems._32_5_ = 0;
      local_68._37_8_ = 0;
      local_a8.data._M_elems._0_8_ = SEXT48((this->u).col.used);
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                (&local_68,&(this->colMemMult).m_backend,(longlong *)&local_a8);
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 10;
      local_a8.data._M_elems[0] = 0;
      local_a8.data._M_elems[1] = 0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems._24_5_ = 0;
      local_a8.data._M_elems[7]._1_3_ = 0;
      local_a8.data._M_elems._32_5_ = 0;
      local_a8._37_8_ = 0;
      local_b0 = (long)len;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                (&local_a8,&local_68,&local_b0);
      tVar5 = boost::multiprecision::operator<
                        (&(this->u).col.size,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_a8);
      iVar7 = (this->u).col.used;
      if (tVar5) {
        minColMem(this,len + iVar7 * 2);
        iVar7 = (this->u).col.used;
      }
    }
    piVar1 = (this->u).col.start;
    lVar6 = (long)piVar1[p_col];
    lVar9 = (this->u).col.len[p_col] + lVar6;
    piVar1[p_col] = iVar7;
    piVar1 = &(this->u).col.used;
    *piVar1 = *piVar1 + len;
    pDVar2 = (this->u).col.elem;
    piVar1 = (this->u).col.max;
    pDVar3 = pDVar2[p_col].prev;
    piVar1[pDVar3->idx] = piVar1[pDVar3->idx] + piVar1[p_col];
    piVar1[p_col] = len;
    pDVar4 = pDVar2[p_col].next;
    pDVar4->prev = pDVar3;
    pDVar3->next = pDVar4;
    pDVar3 = (this->u).col.list.prev;
    pDVar4 = pDVar3->next;
    pDVar2[p_col].next = pDVar4;
    pDVar4->prev = pDVar2 + p_col;
    pDVar2[p_col].prev = pDVar3;
    pDVar3->next = pDVar2 + p_col;
    piVar1 = (this->u).col.idx;
    lVar8 = (long)iVar7;
    for (; lVar6 < lVar9; lVar6 = lVar6 + 1) {
      piVar1[lVar8] = piVar1[lVar6];
      lVar8 = lVar8 + 1;
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::remaxCol(int p_col, int len)
{
   assert(u.col.max[p_col] < len);

   if(u.col.elem[p_col].next == &(u.col.list))      /* last in column file */
   {
      int delta = len - u.col.max[p_col];

      if(delta > u.col.size - u.col.used)
      {
         packColumns();
         delta = len - u.col.max[p_col];

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(delta <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      u.col.used += delta;
      u.col.max[p_col] = len;
   }

   else                        /* column must be moved to end of column file */
   {
      int i, j, k;
      int* idx;
      Dring* ring;

      if(len > u.col.size - u.col.used)
      {
         packColumns();

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(len <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      j = u.col.used;
      i = u.col.start[p_col];
      k = u.col.len[p_col] + i;
      u.col.start[p_col] = j;
      u.col.used += len;

      u.col.max[u.col.elem[p_col].prev->idx] += u.col.max[p_col];
      u.col.max[p_col] = len;
      removeDR(u.col.elem[p_col]);
      ring = u.col.list.prev;
      init2DR(u.col.elem[p_col], *ring);

      idx = u.col.idx;

      for(; i < k; ++i)
         idx[j++] = idx[i];
   }
}